

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<crnlib::find_files::file_desc>::~vector(vector<crnlib::find_files::file_desc> *this)

{
  file_desc *this_00;
  long lVar1;
  
  this_00 = this->m_p;
  if (this_00 != (file_desc *)0x0) {
    if ((ulong)this->m_size != 0) {
      lVar1 = (ulong)this->m_size * 0x48;
      do {
        find_files::file_desc::~file_desc(this_00);
        this_00 = this_00 + 1;
        lVar1 = lVar1 + -0x48;
      } while (lVar1 != 0);
      this_00 = this->m_p;
    }
    crnlib_free(this_00);
  }
  return;
}

Assistant:

inline ~vector()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
            }
        }